

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O2

BOOL __thiscall Js::TypedArrayBase::IsEnumerable(TypedArrayBase *this,PropertyId propertyId)

{
  BOOL BVar1;
  uint32 local_1c [2];
  uint32 index;
  
  local_1c[0] = 0;
  BVar1 = ScriptContext::IsNumericPropertyId
                    ((((((this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                         super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                     super_JavascriptLibraryBase).scriptContext.ptr,propertyId,local_1c);
  if (BVar1 == 0) {
    BVar1 = DynamicObject::IsEnumerable((DynamicObject *)this,propertyId);
  }
  else {
    BVar1 = 1;
  }
  return BVar1;
}

Assistant:

BOOL TypedArrayBase::IsEnumerable(PropertyId propertyId)
    {
        uint32 index = 0;
        if (GetScriptContext()->IsNumericPropertyId(propertyId, &index))
        {
            return true;
        }
        return DynamicObject::IsEnumerable(propertyId);
    }